

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_unicode_sets.cpp
# Opt level: O2

void anon_unknown.dwarf_27b307::initNumberParseUniSets(UErrorCode *status)

{
  UnicodeSet *pUVar1;
  Key extraout_EDX;
  Key extraout_EDX_00;
  Key KVar2;
  Key k3;
  long lVar3;
  code *pattern;
  char *size;
  UnicodeString *pUVar4;
  UnicodeString local_60;
  ParseDataSink sink;
  LocalUResourceBundlePointer rb;
  
  pattern = cleanupNumberParseUniSets;
  ucln_common_registerCleanup_63(UCLN_COMMON_NUMPARSE_UNISETS,cleanupNumberParseUniSets);
  icu_63::UnicodeSet::UnicodeSet((UnicodeSet *)(anonymous_namespace)::gEmptyUnicodeSet);
  icu_63::UnicodeSet::freeze((UnicodeSet *)(anonymous_namespace)::gEmptyUnicodeSet);
  (anonymous_namespace)::gEmptyUnicodeSetInitialized = 1;
  pUVar1 = (UnicodeSet *)icu_63::UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  if (pUVar1 == (UnicodeSet *)0x0) {
    DAT_00427a48 = (UnicodeSet *)0x0;
  }
  else {
    icu_63::UnicodeString::UnicodeString
              (&local_60,L"[[:Zs:][\\u0009][:Bidi_Control:][:Variation_Selector:]]");
    pattern = (code *)&local_60;
    icu_63::UnicodeSet::UnicodeSet(pUVar1,(UnicodeString *)pattern,status);
    DAT_00427a48 = pUVar1;
    icu_63::UnicodeString::~UnicodeString(&local_60);
  }
  pUVar1 = (UnicodeSet *)icu_63::UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  if (pUVar1 == (UnicodeSet *)0x0) {
    _DAT_00427a50 = (UnicodeSet *)0x0;
  }
  else {
    icu_63::UnicodeString::UnicodeString(&local_60,L"[[:Bidi_Control:]]");
    icu_63::UnicodeSet::UnicodeSet(pUVar1,&local_60,status);
    _DAT_00427a50 = pUVar1;
    icu_63::UnicodeString::~UnicodeString(&local_60);
  }
  rb.super_LocalPointerBase<UResourceBundle>.ptr =
       (LocalPointerBase<UResourceBundle>)ures_open_63((char *)0x0,"root",status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    sink.super_ResourceSink.super_UObject._vptr_UObject = (ResourceSink)&PTR__ResourceSink_003ab570;
    size = "parse";
    ures_getAllItemsWithFallback_63
              ((UResourceBundle *)rb.super_LocalPointerBase<UResourceBundle>.ptr,"parse",
               &sink.super_ResourceSink,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      pUVar1 = (UnicodeSet *)icu_63::UMemory::operator_new((UMemory *)0x58,(size_t)size);
      if (pUVar1 == (UnicodeSet *)0x0) {
        DAT_00427a78 = (UnicodeSet *)0x0;
        KVar2 = extraout_EDX;
      }
      else {
        icu_63::UnicodeString::UnicodeString
                  (&local_60,L"[\'٬‘’＇\\u0020\\u00A0\\u2000-\\u200A\\u202F\\u205F\\u3000]");
        icu_63::UnicodeSet::UnicodeSet(pUVar1,&local_60,status);
        DAT_00427a78 = pUVar1;
        icu_63::UnicodeString::~UnicodeString(&local_60);
        KVar2 = extraout_EDX_00;
      }
      _DAT_00427a80 = computeUnion(COMMA,PERIOD,KVar2);
      pUVar4 = (UnicodeString *)0x6;
      _DAT_00427a88 = computeUnion(STRICT_COMMA,STRICT_PERIOD,k3);
      pUVar1 = (UnicodeSet *)icu_63::UMemory::operator_new((UMemory *)0x58,(size_t)pUVar4);
      if (pUVar1 == (UnicodeSet *)0x0) {
        _DAT_00427aa0 = (UnicodeSet *)0x0;
      }
      else {
        icu_63::UnicodeString::UnicodeString(&local_60,L"[%٪]");
        pUVar4 = &local_60;
        icu_63::UnicodeSet::UnicodeSet(pUVar1,pUVar4,status);
        _DAT_00427aa0 = pUVar1;
        icu_63::UnicodeString::~UnicodeString(&local_60);
      }
      pUVar1 = (UnicodeSet *)icu_63::UMemory::operator_new((UMemory *)0x58,(size_t)pUVar4);
      if (pUVar1 == (UnicodeSet *)0x0) {
        _DAT_00427aa8 = (UnicodeSet *)0x0;
      }
      else {
        icu_63::UnicodeString::UnicodeString(&local_60,L"[‰؉]");
        pUVar4 = &local_60;
        icu_63::UnicodeSet::UnicodeSet(pUVar1,pUVar4,status);
        _DAT_00427aa8 = pUVar1;
        icu_63::UnicodeString::~UnicodeString(&local_60);
      }
      pUVar1 = (UnicodeSet *)icu_63::UMemory::operator_new((UMemory *)0x58,(size_t)pUVar4);
      if (pUVar1 == (UnicodeSet *)0x0) {
        _DAT_00427ab0 = (UnicodeSet *)0x0;
      }
      else {
        icu_63::UnicodeString::UnicodeString(&local_60,L"[∞]");
        pUVar4 = &local_60;
        icu_63::UnicodeSet::UnicodeSet(pUVar1,pUVar4,status);
        _DAT_00427ab0 = pUVar1;
        icu_63::UnicodeString::~UnicodeString(&local_60);
      }
      pUVar1 = (UnicodeSet *)icu_63::UMemory::operator_new((UMemory *)0x58,(size_t)pUVar4);
      if (pUVar1 == (UnicodeSet *)0x0) {
        _DAT_00427ad0 = (UnicodeSet *)0x0;
      }
      else {
        icu_63::UnicodeString::UnicodeString(&local_60,L"[¥\\uffe5]");
        pUVar4 = &local_60;
        icu_63::UnicodeSet::UnicodeSet(pUVar1,pUVar4,status);
        _DAT_00427ad0 = pUVar1;
        icu_63::UnicodeString::~UnicodeString(&local_60);
      }
      pUVar1 = (UnicodeSet *)icu_63::UMemory::operator_new((UMemory *)0x58,(size_t)pUVar4);
      KVar2 = (Key)pUVar4;
      if (pUVar1 == (UnicodeSet *)0x0) {
        DAT_00427ad8 = (UnicodeSet *)0x0;
      }
      else {
        icu_63::UnicodeString::UnicodeString(&local_60,L"[:digit:]");
        pUVar4 = &local_60;
        icu_63::UnicodeSet::UnicodeSet(pUVar1,pUVar4,status);
        KVar2 = (Key)pUVar4;
        DAT_00427ad8 = pUVar1;
        icu_63::UnicodeString::~UnicodeString(&local_60);
      }
      _DAT_00427ae0 = computeUnion(ALL_SEPARATORS,KVar2);
      _DAT_00427ae8 = computeUnion(STRICT_ALL_SEPARATORS,KVar2);
      for (lVar3 = 0; lVar3 != 0xb0; lVar3 = lVar3 + 8) {
        if (*(UnicodeSet **)((long)&(anonymous_namespace)::gUnicodeSets + lVar3) !=
            (UnicodeSet *)0x0) {
          icu_63::UnicodeSet::freeze
                    (*(UnicodeSet **)((long)&(anonymous_namespace)::gUnicodeSets + lVar3));
        }
      }
    }
    icu_63::ResourceSink::~ResourceSink(&sink.super_ResourceSink);
  }
  icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&rb);
  return;
}

Assistant:

void U_CALLCONV initNumberParseUniSets(UErrorCode& status) {
    ucln_common_registerCleanup(UCLN_COMMON_NUMPARSE_UNISETS, cleanupNumberParseUniSets);

    // Initialize the empty instance for well-defined fallback behavior
    new(gEmptyUnicodeSet) UnicodeSet();
    reinterpret_cast<UnicodeSet*>(gEmptyUnicodeSet)->freeze();
    gEmptyUnicodeSetInitialized = TRUE;

    // These sets were decided after discussion with icu-design@. See tickets #13084 and #13309.
    // Zs+TAB is "horizontal whitespace" according to UTS #18 (blank property).
    gUnicodeSets[DEFAULT_IGNORABLES] = new UnicodeSet(
            u"[[:Zs:][\\u0009][:Bidi_Control:][:Variation_Selector:]]", status);
    gUnicodeSets[STRICT_IGNORABLES] = new UnicodeSet(u"[[:Bidi_Control:]]", status);

    LocalUResourceBundlePointer rb(ures_open(nullptr, "root", &status));
    if (U_FAILURE(status)) { return; }
    ParseDataSink sink;
    ures_getAllItemsWithFallback(rb.getAlias(), "parse", sink, status);
    if (U_FAILURE(status)) { return; }

    // NOTE: It is OK for these assertions to fail if there was a no-data build.
    U_ASSERT(gUnicodeSets[COMMA] != nullptr);
    U_ASSERT(gUnicodeSets[STRICT_COMMA] != nullptr);
    U_ASSERT(gUnicodeSets[PERIOD] != nullptr);
    U_ASSERT(gUnicodeSets[STRICT_PERIOD] != nullptr);

    gUnicodeSets[OTHER_GROUPING_SEPARATORS] = new UnicodeSet(
            u"['٬‘’＇\\u0020\\u00A0\\u2000-\\u200A\\u202F\\u205F\\u3000]", status);
    gUnicodeSets[ALL_SEPARATORS] = computeUnion(COMMA, PERIOD, OTHER_GROUPING_SEPARATORS);
    gUnicodeSets[STRICT_ALL_SEPARATORS] = computeUnion(
            STRICT_COMMA, STRICT_PERIOD, OTHER_GROUPING_SEPARATORS);

    U_ASSERT(gUnicodeSets[MINUS_SIGN] != nullptr);
    U_ASSERT(gUnicodeSets[PLUS_SIGN] != nullptr);

    gUnicodeSets[PERCENT_SIGN] = new UnicodeSet(u"[%٪]", status);
    gUnicodeSets[PERMILLE_SIGN] = new UnicodeSet(u"[‰؉]", status);
    gUnicodeSets[INFINITY_KEY] = new UnicodeSet(u"[∞]", status);

    U_ASSERT(gUnicodeSets[DOLLAR_SIGN] != nullptr);
    U_ASSERT(gUnicodeSets[POUND_SIGN] != nullptr);
    U_ASSERT(gUnicodeSets[RUPEE_SIGN] != nullptr);
    gUnicodeSets[YEN_SIGN] = new UnicodeSet(u"[¥\\uffe5]", status);

    gUnicodeSets[DIGITS] = new UnicodeSet(u"[:digit:]", status);

    gUnicodeSets[DIGITS_OR_ALL_SEPARATORS] = computeUnion(DIGITS, ALL_SEPARATORS);
    gUnicodeSets[DIGITS_OR_STRICT_ALL_SEPARATORS] = computeUnion(DIGITS, STRICT_ALL_SEPARATORS);

    for (auto* uniset : gUnicodeSets) {
        if (uniset != nullptr) {
            uniset->freeze();
        }
    }
}